

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socksd.c
# Opt level: O0

curl_socket_t socksconnect(unsigned_short connectport,char *connectaddr)

{
  uint __errnum;
  char *pcVar1;
  ushort uVar2;
  int __fd;
  uint *puVar3;
  char *pcVar4;
  int error;
  curl_socket_t sock;
  srvr_sockaddr_union_t me;
  int rc;
  char *connectaddr_local;
  unsigned_short connectport_local;
  
  unique0x100000ff = connectaddr;
  connectaddr_local._2_2_ = connectport;
  __fd = socket(2,1,0);
  if (__fd == -1) {
    connectaddr_local._4_4_ = -1;
  }
  else {
    memset(&error,0,0x10);
    error._0_2_ = 2;
    error._2_2_ = htons(connectaddr_local._2_2_);
    sock = 0;
    inet_pton(2,stack0xffffffffffffffe8,&sock);
    me._104_4_ = connect(__fd,(sockaddr *)&error,0x10);
    if (me._104_4_ == 0) {
      logmsg("Connected fine to %s:%d",stack0xffffffffffffffe8,(ulong)connectaddr_local._2_2_);
      connectaddr_local._4_4_ = __fd;
    }
    else {
      puVar3 = (uint *)__errno_location();
      uVar2 = connectaddr_local._2_2_;
      pcVar1 = stack0xffffffffffffffe8;
      __errnum = *puVar3;
      pcVar4 = strerror(__errnum);
      logmsg("Error connecting to %s:%hu: (%d) %s",pcVar1,(ulong)uVar2,(ulong)__errnum,pcVar4);
      connectaddr_local._4_4_ = -1;
    }
  }
  return connectaddr_local._4_4_;
}

Assistant:

static curl_socket_t socksconnect(unsigned short connectport,
                                  const char *connectaddr)
{
  int rc;
  srvr_sockaddr_union_t me;
  curl_socket_t sock = socket(AF_INET, SOCK_STREAM, 0);
  if(sock == CURL_SOCKET_BAD)
    return CURL_SOCKET_BAD;
  memset(&me.sa4, 0, sizeof(me.sa4));
  me.sa4.sin_family = AF_INET;
  me.sa4.sin_port = htons(connectport);
  me.sa4.sin_addr.s_addr = INADDR_ANY;
  Curl_inet_pton(AF_INET, connectaddr, &me.sa4.sin_addr);

  rc = connect(sock, &me.sa, sizeof(me.sa4));

  if(rc) {
    int error = SOCKERRNO;
    logmsg("Error connecting to %s:%hu: (%d) %s",
           connectaddr, connectport, error, strerror(error));
    return CURL_SOCKET_BAD;
  }
  logmsg("Connected fine to %s:%d", connectaddr, connectport);
  return sock;
}